

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetComputeFfClasses(Wln_Ntk_t *pNtk,Vec_Int_t *vClasses)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Hsh_VecMan_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vFlop;
  Hsh_VecMan_t *p;
  int nClasses;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vClasses_local;
  Wln_Ntk_t *pNtk_local;
  
  p_00 = Hsh_VecManStart(10);
  p_01 = Vec_IntAlloc(6);
  iVar1 = Wln_NtkObjNum(pNtk);
  Vec_IntFill(vClasses,iVar1,-1);
  for (iObj = 0; iVar1 = Wln_NtkFfNum(pNtk), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Wln_NtkFf(pNtk,iObj);
    Vec_IntClear(p_01);
    for (nClasses = 1; nClasses < 7; nClasses = nClasses + 1) {
      iVar2 = Wln_ObjFanin(pNtk,iVar1,nClasses);
      Vec_IntPush(p_01,iVar2);
    }
    iVar2 = Hsh_VecManAdd(p_00,p_01);
    Vec_IntWriteEntry(vClasses,iVar1,iVar2);
  }
  uVar3 = Hsh_VecSize(p_00);
  Hsh_VecManStop(p_00);
  Vec_IntFree(p_01);
  uVar4 = Wln_NtkFfNum(pNtk);
  printf("Detected %d flops and %d flop classes.\n",(ulong)uVar4,(ulong)uVar3);
  return uVar3;
}

Assistant:

int Wln_RetComputeFfClasses( Wln_Ntk_t * pNtk, Vec_Int_t * vClasses )
{
    int i, k, iObj, nClasses;
    Hsh_VecMan_t * p = Hsh_VecManStart( 10 );
    Vec_Int_t * vFlop = Vec_IntAlloc( 6 ); 
    Vec_IntFill( vClasses, Wln_NtkObjNum(pNtk), -1 );
    Wln_NtkForEachFf( pNtk, iObj, i )
    {
        Vec_IntClear( vFlop );
        for ( k = 1; k <= 6; k++ )
            Vec_IntPush( vFlop, Wln_ObjFanin(pNtk, iObj, k) );
        Vec_IntWriteEntry( vClasses, iObj, Hsh_VecManAdd(p, vFlop) );
    }
    nClasses = Hsh_VecSize( p );
    Hsh_VecManStop( p );
    Vec_IntFree( vFlop );
    printf( "Detected %d flops and %d flop classes.\n", Wln_NtkFfNum(pNtk), nClasses );
    return nClasses;
}